

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.hpp
# Opt level: O3

void __thiscall
de::PoolArray<vkt::(anonymous_namespace)::BuildGlslTask,_8U>::resize
          (PoolArray<vkt::(anonymous_namespace)::BuildGlslTask,_8U> *this,deUintptr newSize)

{
  void **ppvVar1;
  void *pvVar2;
  undefined8 *puVar3;
  deUintptr subNdx;
  ulong uVar4;
  ulong uVar5;
  void **ppvVar6;
  long lVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  deUintptr ndx_1;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  deUintptr ndx;
  ulong uVar11;
  
  uVar8 = this->m_numElements;
  uVar11 = newSize;
  if (newSize < uVar8) {
    do {
      pvVar2 = this->m_pageTable[uVar11 >> 4];
      lVar7 = (ulong)((uint)uVar11 & 0xf) * 0xe0;
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(lVar7 + 0xb8 + (long)pvVar2);
      this_00[-8].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&PTR_execute_00cec040;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_00);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
                 (lVar7 + 0x98 + (long)pvVar2));
      lVar9 = 0x80;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)pvVar2 + lVar9 + lVar7));
        lVar9 = lVar9 + -0x18;
      } while (lVar9 != -0x10);
      uVar11 = uVar11 + 1;
    } while (uVar11 < this->m_numElements);
    this->m_numElements = newSize;
  }
  else if (uVar8 < newSize) {
    uVar11 = this->m_capacity;
    if (uVar11 <= newSize) {
      uVar10 = newSize + 0xf >> 4;
      if (this->m_pageTableCapacity < uVar10) {
        uVar5 = this->m_pageTableCapacity * 2;
        if (uVar5 <= uVar10) {
          uVar5 = uVar10;
        }
        ppvVar1 = (void **)deMemPool_alloc(this->m_pool->m_pool,(long)(uVar5 << 0x23) >> 0x20);
        if (ppvVar1 == (void **)0x0) {
LAB_0038503a:
          puVar3 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar3 = time;
          __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        uVar11 = this->m_pageTableCapacity;
        if (uVar11 != 0) {
          uVar4 = 0;
          do {
            ppvVar1[uVar4] = this->m_pageTable[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar11 != uVar4);
        }
        uVar4 = uVar11 * 8;
        if (uVar11 <= uVar5 && uVar5 - uVar11 != 0) {
          memset(ppvVar1 + uVar11,0,(uVar5 - uVar11) * 8);
        }
        uVar11 = this->m_capacity;
        ppvVar6 = this->m_pageTable;
        this->m_pageTable = ppvVar1;
        this->m_pageTableCapacity = uVar5;
      }
      else {
        uVar4 = 0;
        ppvVar6 = (void **)0x0;
      }
      uVar11 = uVar11 >> 4;
      pvVar2 = (void *)((long)ppvVar6 + 7U & 0xfffffffffffffff8);
      uVar5 = (long)pvVar2 + (0xe00 - (long)ppvVar6);
      if (uVar5 <= uVar4) {
        do {
          uVar4 = uVar4 - uVar5;
          this->m_pageTable[uVar11] = pvVar2;
          uVar11 = uVar11 + 1;
          pvVar2 = (void *)((long)pvVar2 + 0xe00);
          uVar5 = 0xe00;
        } while (0xdff < uVar4);
      }
      uVar4 = uVar11;
      if (uVar11 < uVar10) {
        do {
          pvVar2 = deMemPool_alignedAlloc(this->m_pool->m_pool,0xe00,8);
          if (pvVar2 == (void *)0x0) goto LAB_0038503a;
          this->m_pageTable[uVar11] = pvVar2;
          uVar11 = uVar11 + 1;
          uVar4 = uVar10;
        } while (uVar10 != uVar11);
      }
      this->m_capacity = uVar4 << 4;
    }
    this->m_numElements = newSize;
    do {
      puVar3 = (undefined8 *)
               ((long)this->m_pageTable[uVar8 >> 4] + (ulong)((uint)uVar8 & 0xf) * 0xe0);
      *puVar3 = &PTR_execute_00cec040;
      memset(puVar3 + 1,0,0xac);
      puVar3[0x17] = 0;
      puVar3[0x18] = 0;
      *(undefined8 *)((long)puVar3 + 0xc1) = 0;
      *(undefined8 *)((long)puVar3 + 0xc9) = 0;
      puVar3[0x1b] = 0;
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->m_numElements);
  }
  return;
}

Assistant:

inline void PoolArray<T, Alignment>::resize (deUintptr newSize)
{
	if (newSize < m_numElements)
	{
		// Destruct elements that are no longer active.
		for (deUintptr ndx = newSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::destruct(getPtr(ndx));

		m_numElements = newSize;
	}
	else if (newSize > m_numElements)
	{
		deUintptr prevSize = m_numElements;

		reserve(newSize);
		m_numElements = newSize;

		// Fill new elements with default values
		for (deUintptr ndx = prevSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::constructDefault(getPtr(ndx));
	}
}